

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O0

void test_2d_static<1ul,1ul,30ul,30ul>(void)

{
  ulong uVar1;
  value_type vVar2;
  value_type vVar3;
  size_type sVar4;
  bool bVar5;
  int local_1024 [2];
  dimensions<1UL,_1UL> local_1019;
  int local_1018;
  dimensions<1UL,_1UL> local_1011;
  int *local_1010;
  int *local_1008;
  size_type local_1000;
  dimensions<1UL,_1UL> local_ff1;
  unsigned_long local_ff0;
  size_t true_idx_2;
  dimensions<1UL,_1UL> local_fdd;
  int i_2;
  int local_fd8;
  int j_2;
  int local_fd0;
  dimensions<1UL,_1UL> local_fc9;
  int *local_fc8;
  int *local_fc0;
  size_type local_fb8;
  dimensions<1UL,_1UL> local_fa9;
  unsigned_long local_fa8;
  size_t true_idx_1;
  int local_f98;
  dimensions<1UL,_1UL> local_f91;
  int i_1;
  int local_f8c;
  int j_1;
  int *local_f80;
  size_type local_f78;
  dimensions<1UL,_1UL> local_f69;
  unsigned_long local_f68;
  size_t true_idx;
  int i;
  int j;
  int dptr [961];
  size_type local_48;
  unsigned_long local_40;
  size_type local_38;
  int local_2c;
  size_type local_28;
  int local_1c;
  size_type local_18;
  bool local_d;
  bool local_c;
  layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
  local_b [2];
  layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
  l;
  
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
  ::layout_mapping_right(local_b);
  local_c = std::experimental::
            layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
            ::is_regular();
  local_d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&local_c,&local_d)
  ;
  local_18 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
             ::stride(local_b,0);
  local_1c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&local_18,
             &local_1c);
  local_28 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
             ::stride(local_b,1);
  local_2c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x20,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&local_28,
             &local_2c);
  local_38 = std::experimental::dimensions<30UL,_30UL>::size((dimensions<30UL,_30UL> *)local_b);
  local_40 = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x22,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&local_38,
             &local_40);
  local_48 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
             ::span(local_b);
  stack0xffffffffffffffb0 = 0x3c1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x23,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&local_48,
             (unsigned_long *)(dptr + 0x3c0));
  for (true_idx._4_4_ = 0; uVar1 = (ulong)true_idx._4_4_,
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,1), uVar1 < vVar2;
      true_idx._4_4_ = true_idx._4_4_ + 1) {
    for (true_idx._0_4_ = 0; uVar1 = (ulong)(int)true_idx,
        vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                          ((dimensions<30UL,_30UL> *)local_b,0), uVar1 < vVar2;
        true_idx._0_4_ = (int)true_idx + 1) {
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,1);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>(&local_f69,1);
      local_f68 = (vVar2 + vVar3) * (long)(int)true_idx + (long)true_idx._4_4_;
      local_f78 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                    *)local_b,(int)true_idx,true_idx._4_4_);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2d,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&local_f78,
                 &local_f68);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      local_f80 = &i + sVar4;
      _j_1 = &i + local_f68;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2f,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&local_f80,
                 (int **)&j_1);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      (&i)[sVar4] = 0x2a;
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      local_f8c = 0x2a;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x33,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&i + sVar4,
                 &local_f8c);
    }
  }
  i_1 = 0;
  while( true ) {
    uVar1 = (ulong)i_1;
    vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                      ((dimensions<30UL,_30UL> *)local_b,1);
    std::experimental::
    layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
    ::padding(local_b);
    vVar3 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>(&local_f91,1);
    if (vVar2 + vVar3 <= uVar1) break;
    local_f98 = 0;
    while( true ) {
      uVar1 = (ulong)local_f98;
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,0);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                        ((dimensions<1UL,_1UL> *)((long)&true_idx_1 + 7),0);
      if (vVar2 + vVar3 <= uVar1) break;
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,1);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>(&local_fa9,1);
      local_fa8 = (vVar2 + vVar3) * (long)local_f98 + (long)i_1;
      local_fb8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                    *)local_b,local_f98,i_1);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3c,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&local_fb8,
                 &local_fa8);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                *)local_b,local_f98,i_1);
      local_fc0 = &i + sVar4;
      local_fc8 = &i + local_fa8;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3e,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&local_fc0,
                 &local_fc8);
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,0);
      bVar5 = false;
      if (vVar2 <= (ulong)(long)local_f98) {
        uVar1 = (ulong)local_f98;
        vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                          ((dimensions<30UL,_30UL> *)local_b,0);
        std::experimental::
        layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
        ::padding(local_b);
        vVar3 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>(&local_fc9,0);
        bVar5 = uVar1 < vVar2 + vVar3;
      }
      if (bVar5) {
        sVar4 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                  *)local_b,local_f98,i_1);
        (&i)[sVar4] = 0x11;
        sVar4 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                  *)local_b,local_f98,i_1);
        local_fd0 = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,0x45,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&i + sVar4,
                   &local_fd0);
      }
      else {
        vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                          ((dimensions<30UL,_30UL> *)local_b,1);
        bVar5 = false;
        if (vVar2 <= (ulong)(long)i_1) {
          uVar1 = (ulong)i_1;
          vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                            ((dimensions<30UL,_30UL> *)local_b,1);
          std::experimental::
          layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
          ::padding(local_b);
          vVar3 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                            ((dimensions<1UL,_1UL> *)((long)&j_2 + 3),1);
          bVar5 = uVar1 < vVar2 + vVar3;
        }
        if (bVar5) {
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                    *)local_b,local_f98,i_1);
          (&i)[sVar4] = 0x18;
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                    *)local_b,local_f98,i_1);
          local_fd8 = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x4d,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&i + sVar4
                     ,&local_fd8);
        }
      }
      local_f98 = local_f98 + 1;
    }
    i_1 = i_1 + 1;
  }
  i_2 = 0;
  while( true ) {
    uVar1 = (ulong)i_2;
    vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                      ((dimensions<30UL,_30UL> *)local_b,1);
    std::experimental::
    layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
    ::padding(local_b);
    vVar3 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>(&local_fdd,1);
    if (vVar2 + vVar3 <= uVar1) break;
    true_idx_2._4_4_ = 0;
    while( true ) {
      uVar1 = (ulong)true_idx_2._4_4_;
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,0);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                        ((dimensions<1UL,_1UL> *)((long)&true_idx_2 + 3),0);
      if (vVar2 + vVar3 <= uVar1) break;
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,1);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>(&local_ff1,1);
      local_ff0 = (vVar2 + vVar3) * (long)true_idx_2._4_4_ + (long)i_2;
      local_1000 = std::experimental::
                   layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                   ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                     *)local_b,true_idx_2._4_4_,i_2);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x57,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&local_1000,
                 &local_ff0);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                *)local_b,true_idx_2._4_4_,i_2);
      local_1008 = &i + sVar4;
      local_1010 = &i + local_ff0;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x59,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&local_1008,
                 &local_1010);
      vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                        ((dimensions<30UL,_30UL> *)local_b,0);
      bVar5 = false;
      if (vVar2 <= (ulong)(long)true_idx_2._4_4_) {
        uVar1 = (ulong)true_idx_2._4_4_;
        vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                          ((dimensions<30UL,_30UL> *)local_b,0);
        std::experimental::
        layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
        ::padding(local_b);
        vVar3 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>(&local_1011,0);
        bVar5 = uVar1 < vVar2 + vVar3;
      }
      if (bVar5) {
        sVar4 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                  *)local_b,true_idx_2._4_4_,i_2);
        local_1018 = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,0x5e,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&i + sVar4,
                   &local_1018);
      }
      else {
        vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                          ((dimensions<30UL,_30UL> *)local_b,1);
        bVar5 = false;
        if (vVar2 <= (ulong)(long)i_2) {
          uVar1 = (ulong)i_2;
          vVar2 = std::experimental::dimensions<30UL,_30UL>::operator[]<int>
                            ((dimensions<30UL,_30UL> *)local_b,1);
          std::experimental::
          layout_mapping_right<std::experimental::dimensions<30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>_>
          ::padding(local_b);
          vVar3 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>(&local_1019,1);
          bVar5 = uVar1 < vVar2 + vVar3;
        }
        if (bVar5) {
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                    *)local_b,true_idx_2._4_4_,i_2);
          local_1024[1] = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,100,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&i + sVar4,
                     local_1024 + 1);
        }
        else {
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>>
                                    *)local_b,true_idx_2._4_4_,i_2);
          local_1024[0] = 0x2a;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","42",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x6a,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",&i + sVar4
                     ,local_1024);
        }
      }
      true_idx_2._4_4_ = true_idx_2._4_4_ + 1;
    }
    i_2 = i_2 + 1;
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}